

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::FillPrefixesCMakeSystemVariable(cmFindPackageCommand *this)

{
  long lVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  size_t __n;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  mapped_type *this_00;
  cmValue cVar9;
  string *psVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  long install_prefix_count;
  cmList expanded;
  string install_path_to_remove;
  string local_e8;
  string *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeSystem);
  pcVar3 = (this->super_cmFindCommon).Makefile;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"CMAKE_FIND_NO_INSTALL_PREFIX","");
  bVar6 = cmMakefile::IsOn(pcVar3,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  bVar2 = (this->super_cmFindCommon).NoCMakeInstallPath;
  if (bVar2 == false) {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CMAKE_FIND_USE_INSTALL_PREFIX","");
    bVar7 = cmMakefile::IsDefinitionSet(pcVar3,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar7 = false;
  }
  local_b8 = -1;
  local_90._M_allocated_capacity = (size_type)&local_80;
  local_90._8_8_ = 0;
  local_80 = 0;
  pcVar3 = (this->super_cmFindCommon).Makefile;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT","");
  cVar9 = cmMakefile::GetDefinition(pcVar3,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (cVar9.Value != (string *)0x0) {
    cmStrToLong(cVar9.Value,&local_b8);
  }
  pcVar3 = (this->super_cmFindCommon).Makefile;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE","");
  cVar9 = cmMakefile::GetDefinition(pcVar3,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (cVar9.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)local_90._M_local_buf);
  }
  if (((bVar2 == false) || (local_b8 < 1 || bVar6)) || (local_90._8_8_ == 0)) {
    paVar12 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar12;
    if ((bVar6 & bVar7) == 1) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CMAKE_INSTALL_PREFIX","")
      ;
      cmSearchPath::AddCMakePath(this_00,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar12) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"CMAKE_SYSTEM_PREFIX_PATH","");
      cmSearchPath::AddCMakePath(this_00,&local_e8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"CMAKE_SYSTEM_PREFIX_PATH","");
      cmSearchPath::AddCMakePath(this_00,&local_e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar12) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    paVar12 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"CMAKE_SYSTEM_PREFIX_PATH","");
    psVar10 = (string *)cmMakefile::GetDefinition(pcVar3,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar12) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (psVar10 == (string *)0x0) {
      psVar10 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar4 = (psVar10->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar4,pcVar4 + psVar10->_M_string_length);
    init._M_len = 1;
    init._M_array = &local_e8;
    cmList::cmList((cmList *)local_b0,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar12) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_b0._8_8_;
    if (local_b0._0_8_ != local_b0._8_8_) {
      lVar11 = 0;
      psVar10 = (string *)local_b0._0_8_;
      do {
        __n = psVar10->_M_string_length;
        if (__n == local_90._8_8_) {
          if (__n == 0) {
            bVar6 = true;
          }
          else {
            iVar8 = bcmp((psVar10->_M_dataplus)._M_p,(void *)local_90._M_allocated_capacity,__n);
            bVar6 = iVar8 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        lVar1 = lVar11 + 1;
        if ((!bVar6) || (lVar11 = lVar1, lVar1 != local_b8)) {
          cmSearchPath::AddPath(this_00,psVar10);
        }
        psVar10 = psVar10 + 1;
      } while (psVar10 != (string *)uVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  }
  paVar12 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"CMAKE_SYSTEM_FRAMEWORK_PATH","");
  cmSearchPath::AddCMakePath(this_00,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"CMAKE_SYSTEM_APPBUNDLE_PATH","");
  cmSearchPath::AddCMakePath(this_00,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar12) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_b0._0_8_ = (string *)(local_b0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,
               "CMake variables defined in the Platform file [CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n",
               "");
    anon_unknown.dwarf_5fb995::collectPathsForDebug((string *)local_b0,this_00,0);
    local_e8._M_string_length = (size_type)(this->DebugBuffer)._M_dataplus._M_p;
    local_e8._M_dataplus._M_p = (pointer)(this->DebugBuffer)._M_string_length;
    local_e8.field_2._M_allocated_capacity = 0;
    local_e8.field_2._8_8_ = local_b0._8_8_;
    local_c8 = (string *)local_b0._0_8_;
    local_c0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_e8;
    cmCatViews(&local_50,views);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
    }
  }
  if ((undefined1 *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeSystemVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  const bool install_prefix_in_list =
    !this->Makefile->IsOn("CMAKE_FIND_NO_INSTALL_PREFIX");
  const bool remove_install_prefix = this->NoCMakeInstallPath;
  const bool add_install_prefix = !this->NoCMakeInstallPath &&
    this->Makefile->IsDefinitionSet("CMAKE_FIND_USE_INSTALL_PREFIX");

  // We have 3 possible states for `CMAKE_SYSTEM_PREFIX_PATH` and
  // `CMAKE_INSTALL_PREFIX`.
  // Either we need to remove `CMAKE_INSTALL_PREFIX`, add
  // `CMAKE_INSTALL_PREFIX`, or do nothing.
  //
  // When we need to remove `CMAKE_INSTALL_PREFIX` we remove the Nth occurrence
  // of `CMAKE_INSTALL_PREFIX` from `CMAKE_SYSTEM_PREFIX_PATH`, where `N` is
  // computed by `CMakeSystemSpecificInformation.cmake` while constructing
  // `CMAKE_SYSTEM_PREFIX_PATH`. This ensures that if projects / toolchains
  // have removed `CMAKE_INSTALL_PREFIX` from the list, we don't remove
  // some other entry by mistake
  long install_prefix_count = -1;
  std::string install_path_to_remove;
  if (cmValue to_skip = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT")) {
    cmStrToLong(*to_skip, &install_prefix_count);
  }
  if (cmValue install_value = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE")) {
    install_path_to_remove = *install_value;
  }

  if (remove_install_prefix && install_prefix_in_list &&
      install_prefix_count > 0 && !install_path_to_remove.empty()) {

    cmValue prefix_paths =
      this->Makefile->GetDefinition("CMAKE_SYSTEM_PREFIX_PATH");
    // remove entry from CMAKE_SYSTEM_PREFIX_PATH
    cmList expanded{ *prefix_paths };
    long count = 0;
    for (const auto& path : expanded) {
      bool const to_add =
        !(path == install_path_to_remove && ++count == install_prefix_count);
      if (to_add) {
        paths.AddPath(path);
      }
    }
  } else if (add_install_prefix && !install_prefix_in_list) {
    paths.AddCMakePath("CMAKE_INSTALL_PREFIX");
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  } else {
    // Otherwise the current setup of `CMAKE_SYSTEM_PREFIX_PATH` is correct
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  }

  paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");

  if (this->DebugMode) {
    std::string debugBuffer = "CMake variables defined in the Platform file "
                              "[CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}